

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

void Saig_ManCexMinDerivePhasePriority
               (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int f,
               Vec_Int_t *vRoots)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *vLeaves;
  Aig_Obj_t *pObj;
  long lVar6;
  void *pvVar7;
  
  if (((-1 < f) && (f < vFrameCis->nSize)) && (f < vFramePPs->nSize)) {
    pvVar3 = vFrameCis->pArray[(uint)f];
    if (0 < *(int *)((long)pvVar3 + 4)) {
      pvVar4 = vFramePPs->pArray[(uint)f];
      lVar6 = 0;
      do {
        pVVar5 = pAig->vObjs;
        if (pVVar5 == (Vec_Ptr_t *)0x0) {
          pvVar7 = (void *)0x0;
        }
        else {
          uVar1 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar6 * 4);
          if (((int)uVar1 < 0) || (pVVar5->nSize <= (int)uVar1)) goto LAB_00505641;
          pvVar7 = pVVar5->pArray[uVar1];
        }
        if (*(int *)((long)pvVar4 + 4) <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = *(int *)(*(long *)((long)pvVar4 + 8) + lVar6 * 4);
        *(int *)((long)pvVar7 + 0x28) = iVar2;
        if (iVar2 < 0) {
          __assert_fail("pObj->iData >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                        ,0xe2,
                        "void Saig_ManCexMinDerivePhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *, Vec_Vec_t *, int, Vec_Int_t *)"
                       );
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < *(int *)((long)pvVar3 + 4));
    }
    if (pCex->iFrame == f) {
      vLeaves = (Vec_Int_t *)0x0;
    }
    else {
      if (vFrameCis->nSize <= (int)(f + 1U)) goto LAB_0050569e;
      vLeaves = (Vec_Int_t *)vFrameCis->pArray[f + 1U];
    }
    Saig_ManCexMinGetCos(pAig,pCex,vLeaves,vRoots);
    Aig_ManIncrementTravId(pAig);
    if (0 < vRoots->nSize) {
      lVar6 = 0;
      do {
        pVVar5 = pAig->vObjs;
        if (pVVar5 == (Vec_Ptr_t *)0x0) {
          pObj = (Aig_Obj_t *)0x0;
        }
        else {
          uVar1 = vRoots->pArray[lVar6];
          if (((int)uVar1 < 0) || (pVVar5->nSize <= (int)uVar1)) {
LAB_00505641:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj = (Aig_Obj_t *)pVVar5->pArray[uVar1];
        }
        Saig_ManCexMinDerivePhasePriority_rec(pAig,pObj);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vRoots->nSize);
    }
    return;
  }
LAB_0050569e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
}

Assistant:

void Saig_ManCexMinDerivePhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int f, Vec_Int_t * vRoots )
{
    Vec_Int_t * vFramePPsOne, * vFrameCisOne, * vLeaves;
    Aig_Obj_t * pObj;
    int i;
    // set PP for the CIs
    vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
    vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
    Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
    {
        pObj->iData = Vec_IntEntry( vFramePPsOne, i );
        assert( pObj->iData >= 0 );
    }
//    if ( f == 0 )
//        Saig_ManCexMinVerifyPhase( pAig, pCex, f );

    // create roots
    vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
    Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
    // derive for the nodes starting from the roots
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
    {
        Saig_ManCexMinDerivePhasePriority_rec( pAig, pObj );
//        if ( f == 0 )
//            assert( (pObj->iData & 1) == pObj->fPhase );
    }
}